

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::checkseg4split(tetgenmesh *this,face *chkseg,point *encpt,int *qflag)

{
  shellface p1;
  shellface p2;
  tetgenbehavior *ptVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  double *p2_00;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double local_58;
  double ccent [3];
  
  p1 = chkseg->sh[sorgpivot[chkseg->shver]];
  p2 = chkseg->sh[sdestpivot[chkseg->shver]];
  *encpt = (point)0x0;
  *qflag = 0;
  dVar7 = distance(this,(double *)p1,(double *)p2);
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    ccent[lVar4] = ((double)p1[lVar4] + (double)p2[lVar4]) * 0.5;
  }
  if ((((this->checkconstraints != 0) && (0.0 < (double)chkseg->sh[this->areaboundindex])) &&
      ((double)chkseg->sh[this->areaboundindex] < dVar7)) ||
     ((ptVar1 = this->b, ptVar1->fixedvolume != 0 &&
      (dVar8 = dVar7 * dVar7 * dVar7, ptVar1->maxvolume <= dVar8 && dVar8 != ptVar1->maxvolume)))) {
LAB_00140e76:
    *qflag = 1;
    uVar3 = 1;
  }
  else {
    dVar7 = dVar7 * 0.5;
    if (ptVar1->metric != 0) {
      if (((0.0 < (double)p1[this->pointmtrindex]) && ((double)p1[this->pointmtrindex] < dVar7)) ||
         ((0.0 < (double)p2[this->pointmtrindex] && ((double)p2[this->pointmtrindex] < dVar7))))
      goto LAB_00140e76;
    }
    uVar3 = (uint)chkseg->sh[9] & 0xf;
    uVar6 = (ulong)chkseg->sh[9] & 0xfffffffffffffff0;
    local_58 = 0.0;
    uVar5 = uVar6;
    do {
      p2_00 = *(double **)(uVar5 + (long)apexpivot[(int)uVar3] * 8);
      if (p2_00 != this->dummypoint) {
        dVar8 = distance(this,ccent,p2_00);
        if ((dVar8 - dVar7 < 0.0) && (this->b->epsilon <= ABS(dVar8 - dVar7) / dVar7)) {
          if (this->useinsertradius == 0) {
            *encpt = p2_00;
            goto LAB_00140f81;
          }
          if ((*encpt == (point)0x0) || (dVar8 < local_58)) {
            *encpt = p2_00;
            local_58 = dVar8;
          }
        }
      }
      uVar2 = *(ulong *)(uVar5 + (long)facepivot1[(int)uVar3] * 8);
      uVar5 = uVar2 & 0xfffffffffffffff0;
      uVar3 = facepivot2[(int)uVar3][(uint)uVar2 & 0xf];
    } while (uVar5 != uVar6);
    p2_00 = *encpt;
LAB_00140f81:
    uVar3 = (uint)(p2_00 != (double *)0x0);
  }
  return uVar3;
}

Assistant:

int tetgenmesh::checkseg4split(face *chkseg, point& encpt, int& qflag)
{
  REAL ccent[3], len, r;
  int i;

  point forg = sorg(*chkseg);
  point fdest = sdest(*chkseg);

  // Initialize the return values.
  encpt = NULL;
  qflag = 0;

  len = distance(forg, fdest);
  r = 0.5 * len;
  for (i = 0; i < 3; i++) {
    ccent[i] = 0.5 * (forg[i] + fdest[i]);
  }

  // First check its quality.
  if (checkconstraints && (areabound(*chkseg) > 0.0)) {
    if (len > areabound(*chkseg)) {
      qflag = 1;
      return 1;
    }
  }

  if (b->fixedvolume) {
    if ((len * len * len) > b->maxvolume) {
      qflag = 1;
      return 1;
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Check if the ccent lies outside one of the prot.balls at vertices.
    if (((forg[pointmtrindex] > 0) && (r > forg[pointmtrindex])) ||
        ((fdest[pointmtrindex]) > 0 && (r > fdest[pointmtrindex]))) {
      qflag = 1; // Enforce mesh size.
      return 1;
    }
  }


  // Second check if it is encroached.
  // Comment: There may exist more than one encroaching points of this segment. 
  //   The 'encpt' returns the one which is closet to it.
  triface searchtet, spintet;
  point eapex;
  REAL d, diff, smdist = 0;
  int t1ver;

  sstpivot1(*chkseg, searchtet);
  spintet = searchtet;
  while (1) {
    eapex = apex(spintet);
    if (eapex != dummypoint) {
      d = distance(ccent, eapex);
      diff = d - r;
      if (fabs(diff) / r < b->epsilon) diff = 0.0; // Rounding.
      if (diff < 0) {
        // This segment is encroached by eapex.
        if (useinsertradius) {
          if (encpt == NULL) {
            encpt = eapex;
            smdist = d;
          } else {
            // Choose the closet encroaching point.
            if (d < smdist) {
              encpt = eapex;
              smdist = d;
            }
          }
        } else {
          encpt = eapex;
          break;
        }
      }
    }
    fnextself(spintet);
    if (spintet.tet == searchtet.tet) break;
  } // while (1)

  if (encpt != NULL) {
    return 1;
  }

  return 0; // No need to split it.
}